

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ushort uVar5;
  ulong uVar6;
  BrotliDictionary *pBVar7;
  int iVar8;
  int iVar9;
  uint32_t uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint8_t uVar19;
  byte bVar20;
  size_t sVar21;
  long lVar22;
  uint8_t *puVar23;
  ulong uVar24;
  uint16_t uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined4 uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  int iVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  HasherCommon *self;
  ulong local_130;
  int local_124;
  ulong local_100;
  Command *local_f8;
  ulong local_f0;
  ulong local_d8;
  ulong local_98;
  ulong local_90;
  uint local_80;
  
  uVar13 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar4 = (position - 7) + num_bytes;
  sVar21 = position;
  if (7 < num_bytes) {
    sVar21 = uVar4;
  }
  lVar22 = 0x200;
  if (params->quality < 9) {
    lVar22 = 0x40;
  }
  uVar1 = position + num_bytes;
  lVar3 = position - 1;
  uVar24 = *last_insert_len;
  uVar36 = lVar22 + position;
  local_f8 = commands;
  do {
    while( true ) {
      uVar18 = position;
      if (uVar1 <= uVar18 + 8) {
        *last_insert_len = (uVar24 + uVar1) - uVar18;
        *num_commands = *num_commands + ((long)local_f8 - (long)commands >> 4);
        return;
      }
      uVar42 = uVar1 - uVar18;
      uVar30 = uVar13;
      if (uVar18 < uVar13) {
        uVar30 = uVar18;
      }
      uVar6 = (params->dist).max_distance;
      piVar2 = (int *)(ringbuffer + (uVar18 & ringbuffer_mask));
      uVar14 = (ulong)(*(long *)(ringbuffer + (uVar18 & ringbuffer_mask)) * -0x42e1ca5843000000) >>
               0x30;
      local_90 = (ulong)*dist_cache;
      uVar19 = (uint8_t)*(long *)(ringbuffer + (uVar18 & ringbuffer_mask));
      uVar31 = (undefined4)uVar18;
      local_80 = (uint)ringbuffer_mask;
      if ((uVar18 - local_90 < uVar18) &&
         (uVar38 = (ulong)((uint)(uVar18 - local_90) & local_80), ringbuffer[uVar38] == uVar19))
      break;
LAB_0010149a:
      uVar37 = *(uint *)(hasher + uVar14 * 4 + 0x28);
      *(undefined4 *)(hasher + uVar14 * 4 + 0x28) = uVar31;
      uVar38 = (ulong)(local_80 & uVar37);
      if (((ringbuffer[uVar38] == uVar19) && (uVar18 != uVar37)) &&
         (local_90 = uVar18 - uVar37, local_90 <= uVar30)) {
        uVar41 = uVar42 & 0xfffffffffffffff8;
        uVar33 = 0;
        lVar26 = 0;
LAB_001014e8:
        if (uVar42 >> 3 == uVar33) {
          uVar34 = (ulong)((uint)uVar42 & 7);
          for (; (bVar43 = uVar34 != 0, uVar34 = uVar34 - 1, uVar33 = uVar42, bVar43 &&
                 (uVar33 = uVar41,
                 ringbuffer[uVar41 + uVar38] == *(uint8_t *)((long)piVar2 + uVar41)));
              uVar41 = uVar41 + 1) {
          }
        }
        else {
          if (*(ulong *)(piVar2 + uVar33 * 2) == *(ulong *)(ringbuffer + uVar33 * 8 + uVar38))
          goto code_r0x00101503;
          uVar33 = *(ulong *)(ringbuffer + uVar33 * 8 + uVar38) ^ *(ulong *)(piVar2 + uVar33 * 2);
          uVar38 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          uVar33 = (uVar38 >> 3 & 0x1fffffff) - lVar26;
        }
        if (3 < uVar33) {
          iVar12 = 0x1f;
          if ((uint)local_90 != 0) {
            for (; (uint)local_90 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          local_130 = (ulong)(iVar12 * -0x1e + 0x780) + uVar33 * 0x87;
          if (0x7e4 < local_130) goto LAB_00101868;
        }
        uVar38 = *(ulong *)(hasher + 0x18);
        local_d8 = *(ulong *)(hasher + 0x20);
        if (uVar38 >> 7 <= local_d8) {
          uVar41 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          bVar43 = true;
          local_90 = 0;
          local_130 = 0x7e4;
          uVar33 = 0;
          local_124 = 0;
          while (bVar43) {
            uVar5 = (params->dictionary).hash_table[uVar41];
            uVar38 = uVar38 + 1;
            *(ulong *)(hasher + 0x18) = uVar38;
            if (uVar5 != 0) {
              uVar37 = uVar5 & 0x1f;
              uVar34 = (ulong)uVar37;
              if (uVar34 <= uVar42) {
                pBVar7 = (params->dictionary).words;
                lVar26 = (ulong)pBVar7->offsets_by_length[uVar34] + uVar34 * (uVar5 >> 5);
                uVar40 = (uint)uVar5;
                uVar15 = (ulong)(uVar40 & 0x18);
                uVar27 = 0;
LAB_00101604:
                if ((uVar5 & 0x18) == uVar27) {
                  local_f0 = (ulong)(uVar40 & 7);
                  puVar23 = pBVar7->data + uVar27 + lVar26;
                  for (; (bVar43 = local_f0 != 0, local_f0 = local_f0 - 1,
                         uVar27 = (ulong)(uVar40 & 0x1f), bVar43 &&
                         (uVar27 = uVar15, *(uint8_t *)((long)piVar2 + uVar15) == *puVar23));
                      uVar15 = uVar15 + 1) {
                    puVar23 = puVar23 + 1;
                  }
                }
                else {
                  uVar28 = *(ulong *)(pBVar7->data + uVar27 + lVar26);
                  if (uVar28 == *(ulong *)((long)piVar2 + uVar27)) goto code_r0x00101620;
                  uVar28 = *(ulong *)((long)piVar2 + uVar27) ^ uVar28;
                  uVar15 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  uVar27 = (uVar15 >> 3 & 0x1fffffff) + uVar27;
                }
                if (((uVar27 != 0) && (uVar34 < (params->dictionary).cutoffTransformsCount + uVar27)
                    ) && (uVar34 = (ulong)(uVar5 >> 5) + uVar30 + 1 +
                                   ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                                  ((char)(uVar34 - uVar27) * '\x06' & 0x3fU)) & 0x3f
                                           ) + (uVar34 - uVar27) * 4 <<
                                   (pBVar7->size_bits_by_length[uVar34] & 0x3f)), uVar34 <= uVar6))
                {
                  iVar12 = 0x1f;
                  if ((uint)uVar34 != 0) {
                    for (; (uint)uVar34 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                    }
                  }
                  uVar15 = (uVar27 * 0x87 - (ulong)(uint)(iVar12 * 0x1e)) + 0x780;
                  if (local_130 <= uVar15) {
                    local_124 = uVar37 - (int)uVar27;
                    local_d8 = local_d8 + 1;
                    *(ulong *)(hasher + 0x20) = local_d8;
                    local_130 = uVar15;
                    uVar33 = uVar27;
                    local_90 = uVar34;
                  }
                }
              }
            }
            uVar41 = uVar41 + 1;
            bVar43 = false;
          }
          *(undefined4 *)(hasher + uVar14 * 4 + 0x28) = uVar31;
          if (0x7e4 < local_130) goto LAB_00101870;
        }
      }
      uVar24 = uVar24 + 1;
      position = uVar18 + 1;
      if (uVar36 < position) {
        if (uVar36 + (uint)((int)lVar22 * 4) < position) {
          uVar30 = uVar18 + 0x11;
          if (uVar4 <= uVar18 + 0x11) {
            uVar30 = uVar4;
          }
          for (; position < uVar30; position = position + 4) {
            *(int *)(hasher + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                      -0x42e1ca5843000000) >> 0x30) * 4 + 0x28) = (int)position;
            uVar24 = uVar24 + 4;
          }
        }
        else {
          uVar30 = uVar18 + 9;
          if (uVar4 <= uVar18 + 9) {
            uVar30 = uVar4;
          }
          for (; position < uVar30; position = position + 2) {
            *(int *)(hasher + ((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                      -0x42e1ca5843000000) >> 0x30) * 4 + 0x28) = (int)position;
            uVar24 = uVar24 + 2;
          }
        }
      }
    }
    uVar41 = uVar42 & 0xfffffffffffffff8;
    uVar33 = 0;
    lVar26 = 0;
LAB_0010143d:
    if (uVar42 >> 3 == uVar33) {
      uVar34 = (ulong)((uint)uVar42 & 7);
      for (; (bVar43 = uVar34 != 0, uVar34 = uVar34 - 1, uVar33 = uVar42, bVar43 &&
             (uVar33 = uVar41, ringbuffer[uVar41 + uVar38] == *(uint8_t *)((long)piVar2 + uVar41)));
          uVar41 = uVar41 + 1) {
      }
    }
    else {
      if (*(ulong *)(piVar2 + uVar33 * 2) == *(ulong *)(ringbuffer + uVar33 * 8 + uVar38)) break;
      uVar33 = *(ulong *)(ringbuffer + uVar33 * 8 + uVar38) ^ *(ulong *)(piVar2 + uVar33 * 2);
      uVar38 = 0;
      if (uVar33 != 0) {
        for (; (uVar33 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
        }
      }
      uVar33 = (uVar38 >> 3 & 0x1fffffff) - lVar26;
    }
    if ((uVar33 < 4) || (local_130 = uVar33 * 0x87 + 0x78f, local_130 < 0x7e5)) goto LAB_0010149a;
    *(undefined4 *)(hasher + uVar14 * 4 + 0x28) = uVar31;
LAB_00101868:
    local_124 = 0;
LAB_00101870:
    iVar12 = *dist_cache;
    uVar30 = (lVar3 + num_bytes) - uVar18;
    iVar9 = 0;
    uVar36 = uVar24;
    do {
      uVar38 = (ulong)((uint)uVar30 & 7);
      uVar42 = uVar42 - 1;
      uVar14 = uVar33 - 1;
      if (uVar42 <= uVar33 - 1) {
        uVar14 = uVar42;
      }
      if (4 < params->quality) {
        uVar14 = 0;
      }
      uVar41 = uVar18 + 1;
      local_100 = uVar13;
      if (uVar41 < uVar13) {
        local_100 = uVar41;
      }
      piVar2 = (int *)(ringbuffer + (uVar41 & ringbuffer_mask));
      uVar27 = (ulong)(*(long *)(ringbuffer + (uVar41 & ringbuffer_mask)) * -0x42e1ca5843000000) >>
               0x30;
      uVar19 = *(uint8_t *)(uVar14 + (long)piVar2);
      uVar34 = uVar41 - (long)iVar12;
      uVar31 = (undefined4)uVar41;
      if ((uVar34 < uVar41) &&
         (uVar37 = (uint)uVar34 & local_80, uVar19 == ringbuffer[uVar14 + uVar37])) {
        uVar34 = 0;
        lVar26 = 0;
LAB_0010194b:
        if (uVar30 >> 3 == uVar34) {
          uVar15 = uVar38;
          for (uVar34 = -lVar26;
              (bVar43 = uVar15 != 0, uVar15 = uVar15 - 1, bVar43 &&
              (ringbuffer[uVar34 + uVar37] == *(uint8_t *)((long)piVar2 + uVar34)));
              uVar34 = uVar34 + 1) {
          }
        }
        else {
          if (*(ulong *)(piVar2 + uVar34 * 2) == *(ulong *)(ringbuffer + uVar34 * 8 + (ulong)uVar37)
             ) goto code_r0x00101969;
          uVar15 = *(ulong *)(ringbuffer + uVar34 * 8 + (ulong)uVar37) ^
                   *(ulong *)(piVar2 + uVar34 * 2);
          uVar34 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
            }
          }
          uVar34 = (uVar34 >> 3 & 0x1fffffff) - lVar26;
        }
        if ((uVar34 < 4) || (uVar15 = uVar34 * 0x87 + 0x78f, uVar15 < 0x7e5)) goto LAB_001019c0;
        *(undefined4 *)(hasher + uVar27 * 4 + 0x28) = uVar31;
        uVar14 = uVar34;
        uVar34 = (long)iVar12;
LAB_00101a45:
        iVar39 = 0;
        uVar28 = uVar14;
      }
      else {
LAB_001019c0:
        uVar37 = *(uint *)(hasher + uVar27 * 4 + 0x28);
        *(undefined4 *)(hasher + uVar27 * 4 + 0x28) = uVar31;
        uVar40 = local_80 & uVar37;
        uVar15 = 0x7e4;
        if (uVar19 != ringbuffer[uVar14 + uVar40]) {
          uVar34 = 0;
          goto LAB_00101a45;
        }
        if ((uVar41 == uVar37) || (uVar34 = uVar41 - uVar37, local_100 < uVar34)) {
          uVar34 = 0;
          iVar39 = 0;
          uVar28 = uVar14;
        }
        else {
          uVar15 = 0;
          lVar26 = 0;
LAB_00101a01:
          if (uVar30 >> 3 == uVar15) {
            for (uVar28 = -lVar26;
                (bVar43 = uVar38 != 0, uVar38 = uVar38 - 1, bVar43 &&
                (ringbuffer[uVar28 + uVar40] == *(uint8_t *)((long)piVar2 + uVar28)));
                uVar28 = uVar28 + 1) {
            }
          }
          else {
            if (*(ulong *)(piVar2 + uVar15 * 2) ==
                *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)uVar40)) goto code_r0x00101a25;
            uVar15 = *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)uVar40) ^
                     *(ulong *)(piVar2 + uVar15 * 2);
            uVar38 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
              }
            }
            uVar28 = (uVar38 >> 3 & 0x1fffffff) - lVar26;
          }
          if (3 < uVar28) {
            iVar8 = 0x1f;
            if ((uint)uVar34 != 0) {
              for (; (uint)uVar34 >> iVar8 == 0; iVar8 = iVar8 + -1) {
              }
            }
            iVar39 = 0;
            uVar15 = (ulong)(iVar8 * -0x1e + 0x780) + uVar28 * 0x87;
            if (0x7e4 < uVar15) goto LAB_00101d3e;
          }
          uVar38 = *(ulong *)(hasher + 0x18);
          local_98 = *(ulong *)(hasher + 0x20);
          if (local_98 < uVar38 >> 7) {
            uVar15 = 0x7e4;
            iVar39 = 0;
            uVar34 = 0;
          }
          else {
            uVar28 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
            bVar43 = true;
            uVar15 = 0x7e4;
            iVar39 = 0;
            uVar34 = 0;
            while (bVar43) {
              uVar5 = (params->dictionary).hash_table[uVar28];
              uVar38 = uVar38 + 1;
              *(ulong *)(hasher + 0x18) = uVar38;
              if (uVar5 != 0) {
                uVar37 = uVar5 & 0x1f;
                uVar35 = (ulong)uVar37;
                if (uVar35 <= uVar42) {
                  pBVar7 = (params->dictionary).words;
                  lVar26 = (ulong)pBVar7->offsets_by_length[uVar35] + uVar35 * (uVar5 >> 5);
                  uVar17 = (ulong)(uVar5 & 0x18);
                  uVar16 = 0;
LAB_00101b99:
                  if ((uVar5 & 0x18) == uVar16) {
                    uVar29 = (ulong)(uVar5 & 7);
                    puVar23 = pBVar7->data + uVar16 + lVar26;
                    for (; (bVar43 = uVar29 != 0, uVar29 = uVar29 - 1,
                           uVar16 = (ulong)(uVar5 & 0x1f), bVar43 &&
                           (uVar16 = uVar17, *(uint8_t *)((long)piVar2 + uVar17) == *puVar23));
                        uVar17 = uVar17 + 1) {
                      puVar23 = puVar23 + 1;
                    }
                  }
                  else {
                    uVar29 = *(ulong *)(pBVar7->data + uVar16 + lVar26);
                    if (uVar29 == *(ulong *)((long)piVar2 + uVar16)) goto code_r0x00101bba;
                    uVar29 = *(ulong *)((long)piVar2 + uVar16) ^ uVar29;
                    uVar17 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    uVar16 = (uVar17 >> 3 & 0x1fffffff) + uVar16;
                  }
                  if (((uVar16 != 0) &&
                      (uVar35 < (params->dictionary).cutoffTransformsCount + uVar16)) &&
                     (uVar35 = (ulong)(uVar5 >> 5) + local_100 + 1 +
                               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                              ((char)(uVar35 - uVar16) * '\x06' & 0x3fU)) & 0x3f) +
                                (uVar35 - uVar16) * 4 <<
                               (pBVar7->size_bits_by_length[uVar35] & 0x3f)), uVar35 <= uVar6)) {
                    iVar8 = 0x1f;
                    if ((uint)uVar35 != 0) {
                      for (; (uint)uVar35 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                      }
                    }
                    uVar17 = (uVar16 * 0x87 - (ulong)(uint)(iVar8 * 0x1e)) + 0x780;
                    if (uVar15 <= uVar17) {
                      iVar39 = uVar37 - (int)uVar16;
                      local_98 = local_98 + 1;
                      *(ulong *)(hasher + 0x20) = local_98;
                      uVar15 = uVar17;
                      uVar14 = uVar16;
                      uVar34 = uVar35;
                    }
                  }
                }
              }
              uVar28 = uVar28 + 1;
              bVar43 = false;
            }
          }
          *(undefined4 *)(hasher + uVar27 * 4 + 0x28) = uVar31;
          uVar28 = uVar14;
        }
      }
LAB_00101d3e:
      if (uVar15 < local_130 + 0xaf) {
        uVar14 = uVar36;
        uVar41 = uVar18;
        uVar28 = uVar33;
        uVar34 = local_90;
        iVar39 = local_124;
        local_100 = uVar13;
        if (uVar18 < uVar13) {
          local_100 = uVar18;
        }
        break;
      }
      uVar14 = uVar24 + 4;
      if (iVar9 == 3) break;
      uVar14 = uVar36 + 1;
      iVar9 = iVar9 + 1;
      uVar38 = uVar18 + 9;
      uVar30 = uVar30 - 1;
      uVar36 = uVar14;
      uVar18 = uVar41;
      uVar33 = uVar28;
      local_130 = uVar15;
      local_124 = iVar39;
      local_90 = uVar34;
    } while (uVar38 < uVar1);
    if (local_100 < uVar34) {
LAB_00101e90:
      uVar36 = uVar34 + 0xf;
LAB_00101e94:
      if ((uVar34 <= local_100) && (uVar36 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = (int)uVar34;
      }
    }
    else {
      if (uVar34 != (long)*dist_cache) {
        uVar36 = 1;
        if (uVar34 != (long)dist_cache[1]) {
          uVar36 = (uVar34 + 3) - (long)*dist_cache;
          if (uVar36 < 7) {
            bVar20 = (byte)((int)uVar36 << 2);
            uVar37 = 0x9750468;
          }
          else {
            uVar36 = (uVar34 + 3) - (long)dist_cache[1];
            if (6 < uVar36) {
              uVar36 = 2;
              if ((uVar34 != (long)dist_cache[2]) && (uVar36 = 3, uVar34 != (long)dist_cache[3]))
              goto LAB_00101e90;
              goto LAB_00101e94;
            }
            bVar20 = (byte)((int)uVar36 << 2);
            uVar37 = 0xfdb1ace;
          }
          uVar36 = (ulong)(uVar37 >> (bVar20 & 0x1f) & 0xf);
        }
        goto LAB_00101e94;
      }
      uVar36 = 0;
    }
    uVar37 = (uint)uVar14;
    local_f8->insert_len_ = uVar37;
    local_130._0_4_ = (uint)uVar28;
    local_f8->copy_len_ = iVar39 << 0x19 | (uint)local_130;
    uVar18 = (ulong)(params->dist).num_direct_distance_codes;
    uVar24 = uVar18 + 0x10;
    uVar10 = 0;
    if (uVar24 <= uVar36) {
      uVar40 = (params->dist).distance_postfix_bits;
      bVar20 = (byte)uVar40;
      uVar18 = ((4L << (bVar20 & 0x3f)) + (uVar36 - uVar18)) - 0x10;
      uVar32 = 0x1f;
      uVar11 = (uint)uVar18;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar32 = (uVar32 ^ 0xffffffe0) + 0x1f;
      uVar30 = (ulong)((uVar18 >> ((ulong)uVar32 & 0x3f) & 1) != 0);
      lVar26 = (ulong)uVar32 - (ulong)uVar40;
      uVar36 = (~(-1 << (bVar20 & 0x1f)) & uVar11) + uVar24 +
               (uVar30 + lVar26 * 2 + 0xfffe << (bVar20 & 0x3f)) | lVar26 * 0x400;
      uVar10 = (uint32_t)(uVar18 - (uVar30 + 2 << ((byte)uVar32 & 0x3f)) >> (bVar20 & 0x3f));
    }
    local_f8->dist_prefix_ = (uint16_t)uVar36;
    local_f8->dist_extra_ = uVar10;
    if (5 < uVar14) {
      if (uVar14 < 0x82) {
        uVar37 = 0x1f;
        uVar40 = (uint)(uVar14 - 2);
        if (uVar40 != 0) {
          for (; uVar40 >> uVar37 == 0; uVar37 = uVar37 - 1) {
          }
        }
        uVar37 = (int)(uVar14 - 2 >> ((char)(uVar37 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar37 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (uVar14 < 0x842) {
        uVar40 = 0x1f;
        if (uVar37 - 0x42 != 0) {
          for (; uVar37 - 0x42 >> uVar40 == 0; uVar40 = uVar40 - 1) {
          }
        }
        uVar37 = (uVar40 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar37 = 0x15;
        if (0x1841 < uVar14) {
          uVar37 = (uint)(ushort)(0x17 - (uVar14 < 0x5842));
        }
      }
    }
    local_130._0_4_ = iVar39 + (uint)local_130;
    if ((uint)local_130 < 10) {
      uVar40 = (uint)local_130 - 2;
    }
    else if ((uint)local_130 < 0x86) {
      local_130._0_4_ = (uint)local_130 - 6;
      uVar40 = 0x1f;
      if ((uint)local_130 != 0) {
        for (; (uint)local_130 >> uVar40 == 0; uVar40 = uVar40 - 1) {
        }
      }
      uVar40 = ((uint)local_130 >> ((char)(uVar40 ^ 0xffffffe0) + 0x1fU & 0x1f)) + 0x42 +
               (uVar40 ^ 0xffffffe0) * 2;
    }
    else {
      uVar40 = 0x17;
      if ((uint)local_130 < 0x846) {
        uVar40 = 0x1f;
        if ((uint)local_130 - 0x46 != 0) {
          for (; (uint)local_130 - 0x46 >> uVar40 == 0; uVar40 = uVar40 - 1) {
          }
        }
        uVar40 = (uVar40 ^ 0xffe0) + 0x2c;
      }
    }
    uVar5 = (ushort)uVar40;
    uVar25 = (uVar5 & 7) + ((ushort)uVar37 & 7) * 8;
    if ((((uVar36 & 0x3ff) == 0) && ((ushort)uVar37 < 8)) && (uVar5 < 0x10)) {
      if (7 < uVar5) {
        uVar25 = uVar25 + 0x40;
      }
    }
    else {
      iVar12 = ((uVar37 & 0xffff) >> 3) * 3 + ((uVar40 & 0xffff) >> 3);
      uVar25 = uVar25 + ((ushort)(0x520d40 >> ((char)iVar12 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar12 * 0x40 + 0x40;
    }
    local_f8->cmd_prefix_ = uVar25;
    *num_literals = *num_literals + uVar14;
    position = uVar28 + uVar41;
    uVar24 = sVar21;
    if (position < sVar21) {
      uVar24 = position;
    }
    uVar18 = uVar41 + 2;
    if (uVar34 < uVar28 >> 2) {
      uVar36 = position + uVar34 * -4;
      if (uVar36 < uVar18) {
        uVar36 = uVar18;
      }
      uVar18 = uVar36;
      if (uVar24 < uVar36) {
        uVar18 = uVar24;
      }
    }
    uVar36 = uVar41 + lVar22 + uVar28 * 2;
    local_f8 = local_f8 + 1;
    for (; uVar18 < uVar24; uVar18 = uVar18 + 1) {
      *(int *)(hasher + ((ulong)(*(long *)(ringbuffer + (uVar18 & ringbuffer_mask)) *
                                -0x42e1ca5843000000) >> 0x30) * 4 + 0x28) = (int)uVar18;
    }
    uVar24 = 0;
  } while( true );
  lVar26 = lVar26 + -8;
  uVar33 = uVar33 + 1;
  goto LAB_0010143d;
code_r0x00101503:
  lVar26 = lVar26 + -8;
  uVar33 = uVar33 + 1;
  goto LAB_001014e8;
code_r0x00101620:
  uVar27 = uVar27 + 8;
  goto LAB_00101604;
code_r0x00101969:
  lVar26 = lVar26 + -8;
  uVar34 = uVar34 + 1;
  goto LAB_0010194b;
code_r0x00101a25:
  lVar26 = lVar26 + -8;
  uVar15 = uVar15 + 1;
  goto LAB_00101a01;
code_r0x00101bba:
  uVar16 = uVar16 + 8;
  goto LAB_00101b99;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}